

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::GL>::iterate
          (TestCaseBase<glcts::ArraysOfArrays::Interface::GL> *this)

{
  TestCaseBase<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[0xb])(this,1);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[0xb])(this,0);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[0xb])(this,2);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[0xb])(this,3);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[0xb])(this,4);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[0xb])(this,5);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TestCaseBase<API>::iterate(void)
{
	test_shader_compilation(TestCaseBase<API>::VERTEX_SHADER_TYPE);
	test_shader_compilation(TestCaseBase<API>::FRAGMENT_SHADER_TYPE);

	if (API::USE_ALL_SHADER_STAGES)
	{
		test_shader_compilation(TestCaseBase<API>::COMPUTE_SHADER_TYPE);
		test_shader_compilation(TestCaseBase<API>::GEOMETRY_SHADER_TYPE);
		test_shader_compilation(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE);
		test_shader_compilation(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE);
	}

	return STOP;
}